

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O1

void cf_chacha20_init(cf_chacha20_ctx *ctx,uint8_t *key,size_t nkey,uint8_t *nonce)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (nkey == 0x20) {
    uVar1 = *(undefined8 *)(key + 8);
    *(undefined8 *)ctx->key0 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key0 + 8) = uVar1;
    uVar1 = *(undefined8 *)(key + 0x18);
    *(undefined8 *)ctx->key1 = *(undefined8 *)(key + 0x10);
    *(undefined8 *)(ctx->key1 + 8) = uVar1;
    pcVar2 = "expand 32-byte k";
  }
  else {
    if (nkey != 0x10) {
      abort();
    }
    uVar1 = *(undefined8 *)(key + 8);
    *(undefined8 *)ctx->key0 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key0 + 8) = uVar1;
    uVar1 = *(undefined8 *)(key + 8);
    *(undefined8 *)ctx->key1 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key1 + 8) = uVar1;
    pcVar2 = "expand 16-byte k";
  }
  ctx->constant = (uint8_t *)pcVar2;
  ctx->nonce[0] = '\0';
  ctx->nonce[1] = '\0';
  ctx->nonce[2] = '\0';
  ctx->nonce[3] = '\0';
  ctx->nonce[4] = '\0';
  ctx->nonce[5] = '\0';
  ctx->nonce[6] = '\0';
  ctx->nonce[7] = '\0';
  ctx->nonce[8] = '\0';
  ctx->nonce[9] = '\0';
  ctx->nonce[10] = '\0';
  ctx->nonce[0xb] = '\0';
  ctx->nonce[0xc] = '\0';
  ctx->nonce[0xd] = '\0';
  ctx->nonce[0xe] = '\0';
  ctx->nonce[0xf] = '\0';
  *(undefined8 *)(ctx->nonce + 8) = *(undefined8 *)nonce;
  ctx->nblock = 0;
  ctx->ncounter = 8;
  return;
}

Assistant:

static void set_key(cf_chacha20_ctx *ctx, const uint8_t *key, size_t nkey)
{
  switch (nkey)
  {
    case 16:
      memcpy(ctx->key0, key, 16);
      memcpy(ctx->key1, key, 16);
      ctx->constant = chacha20_tau;
      break;
    case 32:
      memcpy(ctx->key0, key, 16);
      memcpy(ctx->key1, key + 16, 16);
      ctx->constant = chacha20_sigma;
      break;
    default:
      abort();
  }
}